

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::XmlReporter::listTests
          (XmlReporter *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests)

{
  StringRef text;
  StringRef text_00;
  StringRef text_01;
  StringRef text_02;
  StringRef text_03;
  bool bVar1;
  undefined8 in_RSI;
  long in_RDI;
  ScopedElement sourceTag;
  TestCaseInfo *testInfo;
  ScopedElement innerTag;
  TestCaseHandle *test;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *__range1;
  ScopedElement outerTag;
  string *in_stack_fffffffffffffcd8;
  XmlWriter *in_stack_fffffffffffffce0;
  XmlWriter *in_stack_fffffffffffffce8;
  XmlWriter *in_stack_fffffffffffffcf0;
  allocator<char> *in_stack_fffffffffffffcf8;
  XmlFormatting fmt;
  XmlWriter *in_stack_fffffffffffffd00;
  XmlWriter *in_stack_fffffffffffffd08;
  XmlWriter *in_stack_fffffffffffffd10;
  allocator<char> *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  XmlWriter *in_stack_fffffffffffffd58;
  XmlFormatting fmt_00;
  XmlWriter *in_stack_fffffffffffffd60;
  TestCaseInfo *in_stack_fffffffffffffd68;
  XmlWriter *in_stack_fffffffffffffd70;
  string local_248 [55];
  allocator<char> local_211;
  string local_210 [55];
  allocator<char> local_1d9;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [48];
  string local_180 [55];
  allocator<char> local_149;
  string local_148 [32];
  char *local_128;
  size_type sStack_120;
  undefined1 local_111 [56];
  allocator<char> local_d9;
  string local_d8 [32];
  TestCaseInfo *local_b8;
  allocator<char> local_a9;
  string local_a8 [48];
  reference local_78;
  TestCaseHandle *local_70;
  __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  local_68;
  undefined8 local_60;
  allocator<char> local_41;
  string local_40 [48];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
             (allocator<char> *)in_stack_fffffffffffffd10);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            (in_stack_fffffffffffffd08,(string *)in_stack_fffffffffffffd00,
             (XmlFormatting)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  local_60 = local_10;
  local_68._M_current =
       (TestCaseHandle *)
       std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
                 ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                  in_stack_fffffffffffffcd8);
  local_70 = (TestCaseHandle *)
             std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::end
                       ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                        in_stack_fffffffffffffcd8);
  while( true ) {
    fmt = (XmlFormatting)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
    fmt_00 = (XmlFormatting)((ulong)in_stack_fffffffffffffd58 >> 0x20);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                        *)in_stack_fffffffffffffce0,
                       (__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                        *)in_stack_fffffffffffffcd8);
    if (!bVar1) break;
    local_78 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
               ::operator*(&local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
               (allocator<char> *)in_stack_fffffffffffffd10);
    operator|(Newline,Indent);
    XmlWriter::scopedElement(in_stack_fffffffffffffd08,(string *)in_stack_fffffffffffffd00,fmt);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
    local_b8 = TestCaseHandle::getTestCaseInfo(local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
               (allocator<char> *)in_stack_fffffffffffffd10);
    XmlWriter::startElement
              (in_stack_fffffffffffffcf0,(string *)in_stack_fffffffffffffce8,
               (XmlFormatting)((ulong)in_stack_fffffffffffffce0 >> 0x20));
    StringRef::StringRef((StringRef *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    text.m_size = (size_type)in_stack_fffffffffffffd70;
    text.m_start = (char *)in_stack_fffffffffffffd68;
    in_stack_fffffffffffffd70 = XmlWriter::writeText(in_stack_fffffffffffffd60,text,fmt_00);
    XmlWriter::endElement
              (in_stack_fffffffffffffd10,(XmlFormatting)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_d9);
    in_stack_fffffffffffffd60 = (XmlWriter *)(in_RDI + 0x98);
    in_stack_fffffffffffffd68 = (TestCaseInfo *)local_111;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
               (allocator<char> *)in_stack_fffffffffffffd10);
    in_stack_fffffffffffffd58 =
         XmlWriter::startElement
                   (in_stack_fffffffffffffcf0,(string *)in_stack_fffffffffffffce8,
                    (XmlFormatting)((ulong)in_stack_fffffffffffffce0 >> 0x20));
    local_128 = (local_b8->className).m_start;
    sStack_120 = (local_b8->className).m_size;
    text_00.m_size = (size_type)in_stack_fffffffffffffd70;
    text_00.m_start = (char *)in_stack_fffffffffffffd68;
    XmlWriter::writeText
              (in_stack_fffffffffffffd60,text_00,
               (XmlFormatting)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    XmlWriter::endElement
              (in_stack_fffffffffffffd10,(XmlFormatting)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    std::__cxx11::string::~string((string *)(local_111 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
               (allocator<char> *)in_stack_fffffffffffffd10);
    XmlWriter::startElement
              (in_stack_fffffffffffffcf0,(string *)in_stack_fffffffffffffce8,
               (XmlFormatting)((ulong)in_stack_fffffffffffffce0 >> 0x20));
    TestCaseInfo::tagsAsString_abi_cxx11_(in_stack_fffffffffffffd68);
    StringRef::StringRef((StringRef *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    text_01.m_size = (size_type)in_stack_fffffffffffffd70;
    text_01.m_start = (char *)in_stack_fffffffffffffd68;
    XmlWriter::writeText
              (in_stack_fffffffffffffd60,text_01,
               (XmlFormatting)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    XmlWriter::endElement
              (in_stack_fffffffffffffd10,(XmlFormatting)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator(&local_149);
    in_stack_fffffffffffffd20 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
               (allocator<char> *)in_stack_fffffffffffffd10);
    operator|(Newline,Indent);
    XmlWriter::scopedElement(in_stack_fffffffffffffd08,(string *)in_stack_fffffffffffffd00,fmt);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    in_stack_fffffffffffffd10 = (XmlWriter *)(in_RDI + 0x98);
    in_stack_fffffffffffffd18 = &local_1d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
               (allocator<char> *)in_stack_fffffffffffffd10);
    in_stack_fffffffffffffd08 =
         XmlWriter::startElement
                   (in_stack_fffffffffffffcf0,(string *)in_stack_fffffffffffffce8,
                    (XmlFormatting)((ulong)in_stack_fffffffffffffce0 >> 0x20));
    StringRef::StringRef
              ((StringRef *)in_stack_fffffffffffffcf0,&in_stack_fffffffffffffce8->m_tagIsOpen);
    text_02.m_size = (size_type)in_stack_fffffffffffffd70;
    text_02.m_start = (char *)in_stack_fffffffffffffd68;
    in_stack_fffffffffffffd00 =
         XmlWriter::writeText
                   (in_stack_fffffffffffffd60,text_02,
                    (XmlFormatting)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    XmlWriter::endElement
              (in_stack_fffffffffffffd10,(XmlFormatting)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    in_stack_fffffffffffffcf0 = (XmlWriter *)(in_RDI + 0x98);
    in_stack_fffffffffffffcf8 = &local_211;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
               (allocator<char> *)in_stack_fffffffffffffd10);
    in_stack_fffffffffffffce8 =
         XmlWriter::startElement
                   (in_stack_fffffffffffffcf0,(string *)in_stack_fffffffffffffce8,
                    (XmlFormatting)((ulong)in_stack_fffffffffffffce0 >> 0x20));
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd18);
    StringRef::StringRef((StringRef *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    text_03.m_size = (size_type)in_stack_fffffffffffffd70;
    text_03.m_start = (char *)in_stack_fffffffffffffd68;
    in_stack_fffffffffffffce0 =
         XmlWriter::writeText
                   (in_stack_fffffffffffffd60,text_03,
                    (XmlFormatting)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    XmlWriter::endElement
              (in_stack_fffffffffffffd10,(XmlFormatting)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator(&local_211);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffce0);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffce0);
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
    ::operator++(&local_68);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffce0);
  return;
}

Assistant:

void XmlReporter::listTests(std::vector<TestCaseHandle> const& tests) {
        auto outerTag = m_xml.scopedElement("MatchingTests");
        for (auto const& test : tests) {
            auto innerTag = m_xml.scopedElement("TestCase");
            auto const& testInfo = test.getTestCaseInfo();
            m_xml.startElement("Name", XmlFormatting::Indent)
                 .writeText(testInfo.name, XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
            m_xml.startElement("ClassName", XmlFormatting::Indent)
                 .writeText(testInfo.className, XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
            m_xml.startElement("Tags", XmlFormatting::Indent)
                 .writeText(testInfo.tagsAsString(), XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);

            auto sourceTag = m_xml.scopedElement("SourceInfo");
            m_xml.startElement("File", XmlFormatting::Indent)
                 .writeText(testInfo.lineInfo.file, XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
            m_xml.startElement("Line", XmlFormatting::Indent)
                 .writeText(std::to_string(testInfo.lineInfo.line), XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
        }
    }